

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

bool __thiscall
ON_RenderContentPrivate::SetChild
          (ON_RenderContentPrivate *this,ON_RenderContent *child,wchar_t *child_slot_name)

{
  ON_RenderContentPrivate *this_00;
  bool bVar1;
  ON_RenderContent *pOVar2;
  ONX_Model *pModel;
  ON_RenderContent *existing_child;
  ON_XMLVariant local_130;
  undefined4 local_34;
  lock_guard<std::recursive_mutex> local_30;
  lock_guard<std::recursive_mutex> lg;
  wchar_t *child_slot_name_local;
  ON_RenderContent *child_local;
  ON_RenderContentPrivate *this_local;
  
  lg._M_device = (mutex_type *)child_slot_name;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_30,&this->m_mutex);
  if (child != (ON_RenderContent *)0x0) {
    if (child->_private->m_model != (ONX_Model *)0x0) {
      this_local._7_1_ = false;
      goto LAB_00819524;
    }
    if (child->_private->m_parent != (ON_RenderContent *)0x0) {
      this_local._7_1_ = false;
      goto LAB_00819524;
    }
    if ((lg._M_device == (mutex_type *)0x0) ||
       (((lg._M_device)->super___recursive_mutex_base)._M_mutex.__data.__lock == 0)) {
      this_local._7_1_ = false;
      goto LAB_00819524;
    }
    this_00 = child->_private;
    ::ON_XMLVariant::ON_XMLVariant(&local_130,(wchar_t *)lg._M_device);
    SetPropertyValue(this_00,L"child-slot-name",&local_130);
    ::ON_XMLVariant::~ON_XMLVariant(&local_130);
  }
  pOVar2 = FindChild(this,(wchar_t *)lg._M_device);
  if (pOVar2 == (ON_RenderContent *)0x0) {
    if ((child != (ON_RenderContent *)0x0) && (bVar1 = AddChild(this,child), !bVar1)) {
      this_local._7_1_ = false;
      goto LAB_00819524;
    }
  }
  else {
    bVar1 = ChangeChild(this,pOVar2,child);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00819524;
    }
  }
  if (child != (ON_RenderContent *)0x0) {
    pOVar2 = TopLevel(this);
    child->_private->m_model = pOVar2->_private->m_model;
  }
  this_local._7_1_ = true;
LAB_00819524:
  local_34 = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_30);
  return this_local._7_1_;
}

Assistant:

bool ON_RenderContentPrivate::SetChild(ON_RenderContent* child, const wchar_t* child_slot_name)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr != child)
  {
    if (nullptr != child->_private->m_model)
      return false;

    if (nullptr != child->_private->m_parent)
      return false;

    if ((nullptr == child_slot_name) || (0 == child_slot_name[0]))
      return false;

    child->_private->SetPropertyValue(ON_RENDER_CONTENT_CHILD_SLOT_NAME, child_slot_name);
  }

  // Get any existing child with the same child slot name (may be null).
  auto* existing_child = FindChild(child_slot_name);
  if (nullptr != existing_child)
  {
    // There is an existing child with the same child slot name; replace it.
    if (!ChangeChild(existing_child, child)) // Deletes existing_child.
      return false;
  }
  else
  {
    // No existing child; just add the new one.
    if (nullptr != child)
    {
      if (!AddChild(*child))
        return false;
    }
  }

  if (nullptr != child)
  {
    auto* pModel = TopLevel()._private->m_model;
    child->_private->m_model = pModel;
  }

  return true;
}